

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cpp
# Opt level: O0

string * embree::getCPUVendor_abi_cxx11_(void)

{
  undefined4 *puVar1;
  string *in_RDI;
  int name [4];
  int cpuinfo [4];
  allocator local_49;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38 [9];
  undefined4 local_14;
  undefined4 *local_10;
  
  local_10 = local_38;
  local_14 = 0;
  puVar1 = (undefined4 *)cpuid_basic_info(0);
  local_38[0] = *puVar1;
  local_48 = puVar1[1];
  local_44 = puVar1[2];
  local_40 = puVar1[3];
  local_3c = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,(char *)&local_48,&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  return in_RDI;
}

Assistant:

std::string getCPUVendor()
  {
#if defined(__X86_ASM__)
    int cpuinfo[4]; 
    __cpuid (cpuinfo, 0); 
    int name[4];
    name[0] = cpuinfo[1];
    name[1] = cpuinfo[3];
    name[2] = cpuinfo[2];
    name[3] = 0;
    return (char*)name;
#elif defined(__ARM_NEON)
    return "ARM";
#else
    return "Unknown";
#endif
  }